

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManCollectLeaves_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,int fFirst)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  long lVar3;
  int Entry;
  
  lVar3 = *(long *)pObj;
  if (fFirst != 0 || -1 < lVar3) {
    do {
      if (((int)(uint)lVar3 < 0) || (uVar2 = (uint)lVar3 & 0x1fffffff, uVar2 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0xef,
                      "void Ga2_ManCollectLeaves_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
      }
      Ga2_ManCollectLeaves_rec(p,pObj + -(ulong)uVar2,vLeaves,0);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      lVar3 = *(long *)pObj;
    } while (-1 < lVar3);
  }
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    Entry = (int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555;
    if (0 < (long)vLeaves->nSize) {
      lVar3 = 0;
      do {
        if (vLeaves->pArray[lVar3] == Entry) {
          return;
        }
        lVar3 = lVar3 + 1;
      } while (vLeaves->nSize != lVar3);
    }
    Vec_IntPush(vLeaves,Entry);
    return;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Ga2_ManCollectLeaves_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, int fFirst )
{
    if ( pObj->fPhase && !fFirst )
    {
        Vec_IntPushUnique( vLeaves, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin0(pObj), vLeaves, 0 );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin1(pObj), vLeaves, 0 );
}